

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

BasicHeapType __thiscall wasm::HeapType::getTop(HeapType *this)

{
  BasicHeapType BVar1;
  Shareability share;
  HeapType local_18;
  HeapType *local_10;
  HeapType *this_local;
  
  local_10 = this;
  BVar1 = getUnsharedTop(this);
  HeapType(&local_18,BVar1);
  share = getShared(this);
  BVar1 = getBasic(&local_18,share);
  return BVar1;
}

Assistant:

BasicHeapType getTop() const {
    return HeapType(getUnsharedTop()).getBasic(getShared());
  }